

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
          (DepthStencilState *this,VkBool32 _depthTestEnable,VkBool32 _depthWriteEnable,
          VkCompareOp _depthCompareOp,VkBool32 _depthBoundsTestEnable,VkBool32 _stencilTestEnable,
          StencilOpState _front,StencilOpState _back,float _minDepthBounds,float _maxDepthBounds)

{
  undefined8 uVar1;
  StencilOpState SVar2;
  StencilOpState SVar3;
  
  SVar3.super_VkStencilOpState = _back.super_VkStencilOpState;
  SVar2.super_VkStencilOpState = _front.super_VkStencilOpState;
  (this->super_VkPipelineDepthStencilStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  (this->super_VkPipelineDepthStencilStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineDepthStencilStateCreateInfo).flags = 0;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthTestEnable = _depthTestEnable;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthWriteEnable = _depthWriteEnable;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthCompareOp = _depthCompareOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).depthBoundsTestEnable = _depthBoundsTestEnable
  ;
  (this->super_VkPipelineDepthStencilStateCreateInfo).stencilTestEnable = _stencilTestEnable;
  uVar1 = _front.super_VkStencilOpState._8_8_;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.failOp =
       _front.super_VkStencilOpState.failOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.passOp =
       _front.super_VkStencilOpState.passOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.depthFailOp = (int)uVar1;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.compareOp = (int)((ulong)uVar1 >> 0x20);
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.compareOp =
       (int)SVar2.super_VkStencilOpState._12_8_;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.compareMask =
       (int)((ulong)SVar2.super_VkStencilOpState._12_8_ >> 0x20);
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.writeMask =
       _front.super_VkStencilOpState.writeMask;
  (this->super_VkPipelineDepthStencilStateCreateInfo).front.reference =
       _front.super_VkStencilOpState.reference;
  uVar1 = _back.super_VkStencilOpState._8_8_;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.failOp =
       _back.super_VkStencilOpState.failOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.passOp =
       _back.super_VkStencilOpState.passOp;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.depthFailOp = (int)uVar1;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.compareOp = (int)((ulong)uVar1 >> 0x20);
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.compareOp =
       (int)SVar3.super_VkStencilOpState._12_8_;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.compareMask =
       (int)((ulong)SVar3.super_VkStencilOpState._12_8_ >> 0x20);
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.writeMask =
       _back.super_VkStencilOpState.writeMask;
  (this->super_VkPipelineDepthStencilStateCreateInfo).back.reference =
       _back.super_VkStencilOpState.reference;
  (this->super_VkPipelineDepthStencilStateCreateInfo).minDepthBounds = _minDepthBounds;
  (this->super_VkPipelineDepthStencilStateCreateInfo).maxDepthBounds = _maxDepthBounds;
  return;
}

Assistant:

PipelineCreateInfo::DepthStencilState::DepthStencilState (vk::VkBool32		_depthTestEnable,
														  vk::VkBool32		_depthWriteEnable,
														  vk::VkCompareOp	_depthCompareOp,
														  vk::VkBool32		_depthBoundsTestEnable,
														  vk::VkBool32		_stencilTestEnable,
														  StencilOpState	_front,
														  StencilOpState	_back,
														  float				_minDepthBounds,
														  float				_maxDepthBounds)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
	pNext = DE_NULL;
	flags					= 0u;
	depthTestEnable			= _depthTestEnable;
	depthWriteEnable		= _depthWriteEnable;
	depthCompareOp			= _depthCompareOp;
	depthBoundsTestEnable	= _depthBoundsTestEnable;
	stencilTestEnable		= _stencilTestEnable;
	front	= _front;
	back	= _back;

	minDepthBounds = _minDepthBounds;
	maxDepthBounds = _maxDepthBounds;
}